

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.cpp
# Opt level: O3

void __thiscall
MergeTest_MergeCorrectness_Test_Test::TestBody(MergeTest_MergeCorrectness_Test_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  unsigned_long __res;
  ulong uVar5;
  int *__s;
  result_type rVar6;
  size_t __i;
  long lVar7;
  value_type_conflict1 *__val;
  char *in_R9;
  int numHeap;
  int iVar8;
  int numHeap_1;
  int *piVar9;
  int elem;
  long lVar10;
  AssertionResult gtest_ar_;
  HeapList tested;
  FoolHeapList fool;
  mt19937 generator;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1450;
  ulong local_1448;
  int *local_1440;
  internal local_1438 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1430;
  HeapList local_1428;
  AssertHelper local_1400;
  HeapList local_13f8;
  string local_13d8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_13b8._M_x[0] = time((time_t *)0x0);
  local_13b8._M_x[0] = local_13b8._M_x[0] & 0xffffffff;
  lVar7 = 1;
  uVar5 = local_13b8._M_x[0];
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar7);
    local_13b8._M_x[lVar7] = uVar5;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x270);
  local_13b8._M_p = 0x270;
  __s = (int *)operator_new(4000000);
  lVar7 = 0;
  memset(__s,0,4000000);
  do {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&local_13b8);
    __s[lVar7] = (int)rVar6;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 1000000);
  local_1448 = 0;
  local_1440 = __s;
  do {
    local_13f8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_13f8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_13f8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_13f8.TYPE = Fool;
    HeapList::AddHeap(&local_13f8,*__s);
    local_1428.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1428.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1428.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1428.TYPE = (HeapType)local_1448;
    for (lVar7 = 1; lVar7 != 1000000; lVar7 = lVar7 + 1) {
      (**(*local_13f8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
           super__Vector_impl_data._M_start)->_vptr_IHeap)
                (*local_13f8.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
                  super__Vector_impl_data._M_start,(ulong)(uint)__s[lVar7]);
    }
    lVar7 = 0;
    piVar9 = __s;
    do {
      HeapList::AddHeap(&local_1428,__s[lVar7 * 1000]);
      lVar10 = 1;
      do {
        (**local_1428.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
           super__Vector_impl_data._M_start[lVar7]->_vptr_IHeap)
                  (local_1428.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7],(ulong)(uint)piVar9[lVar10]);
        __s = local_1440;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 1000);
      lVar7 = lVar7 + 1;
      piVar9 = piVar9 + 1000;
    } while (lVar7 != 1000);
    lVar7 = 1;
    do {
      (*(*local_1428.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
          super__Vector_impl_data._M_start)->_vptr_IHeap[3])();
      local_1428.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] = (IHeap *)0x0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 1000);
    iVar8 = 1000000;
    do {
      iVar2 = HeapList::ExtractMin(&local_13f8,0);
      iVar3 = HeapList::ExtractMin(&local_1428,0);
      local_1438[0] = (internal)(iVar2 == iVar3);
      local_1430.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_1438[0]) {
        testing::Message::Message((Message *)&local_1450);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_13d8,local_1438,
                   (AssertionResult *)"fool.ExtractMin(0) == tested.ExtractMin(0)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1400,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/edgarshmavonyan[P]mergeable_heaps/unit_test.cpp"
                   ,0x76,local_13d8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_1400,(Message *)&local_1450);
        testing::internal::AssertHelper::~AssertHelper(&local_1400);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_13d8._M_dataplus._M_p != &local_13d8.field_2) {
          operator_delete(local_13d8._M_dataplus._M_p);
        }
        if (local_1450.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_1450.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_1450.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_1430,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
    HeapList::~HeapList(&local_1428);
    HeapList::~HeapList(&local_13f8);
    uVar4 = (int)local_1448 + 1;
    local_1448 = (ulong)uVar4;
  } while (uVar4 != 3);
  operator_delete(__s);
  return;
}

Assistant:

TEST(MergeTest, MergeCorrectness_Test) {
    // 1000 heaps with 1000 keys
    std::mt19937 generator(time(0));
    const size_t size = 1000, number = 1000;
    std::vector<int> values(number*size);
    for (int i = 0; i < size * number; i++) {
        values[i] = generator();
    }

    // in order to test binomial, skew and leftist we create 1 fool heap with size * number
    // keys as merging would be too slow
    // it does not change the correctness of the test

    for (int type = 0; type < 3; type++) {
        FoolHeapList fool;
        fool.AddHeap(values[0]);
        HeapList tested(type);

        for (int i = 0; i < size * number - 1; i++)
            fool.Insert(0, values[i + 1]);

        for (int numHeap = 0; numHeap < number; numHeap++) {
            tested.AddHeap(values[numHeap * 1000]);

            for (int elem = 1; elem < size; elem++)
                tested.Insert(numHeap, values[numHeap * 1000 + elem]);
        }

        for (int numHeap = 1; numHeap < number; numHeap++) {
            tested.Meld(0, numHeap);
        }

        for (int i = 0; i < size * number; i++) {
            EXPECT_TRUE(fool.ExtractMin(0) == tested.ExtractMin(0));
        }
    }
}